

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_zip.c
# Opt level: O3

int ZIPSetupDecode(TIFF *tif)

{
  uint8_t *puVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  
  puVar1 = tif->tif_data;
  if (puVar1 == (uint8_t *)0x0) {
    __assert_fail("sp != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_zip.c"
                  ,0x68,"int ZIPSetupDecode(TIFF *)");
  }
  uVar3 = *(uint *)(puVar1 + 0xf4);
  if ((uVar3 & 2) == 0) {
    if ((uVar3 & 1) != 0) goto LAB_002b475c;
  }
  else {
    deflateEnd((z_streamp)(puVar1 + 0x80));
    puVar1[0xf4] = '\0';
    puVar1[0xf5] = '\0';
    puVar1[0xf6] = '\0';
    puVar1[0xf7] = '\0';
  }
  iVar2 = inflateInit_((z_streamp)(puVar1 + 0x80),"1.2.11",0x70);
  if (iVar2 != 0) {
    pcVar4 = "";
    if (*(char **)(puVar1 + 0xb0) != (char *)0x0) {
      pcVar4 = *(char **)(puVar1 + 0xb0);
    }
    TIFFErrorExtR(tif,"ZIPSetupDecode","%s",pcVar4);
    return 0;
  }
  uVar3 = *(uint *)(puVar1 + 0xf4);
LAB_002b475c:
  *(uint *)(puVar1 + 0xf4) = uVar3 | 1;
  return 1;
}

Assistant:

static int ZIPSetupDecode(TIFF *tif)
{
    static const char module[] = "ZIPSetupDecode";
    ZIPState *sp = DecoderState(tif);

    assert(sp != NULL);

    /* if we were last encoding, terminate this mode */
    if (sp->state & ZSTATE_INIT_ENCODE)
    {
        deflateEnd(&sp->stream);
        sp->state = 0;
    }

    /* This function can possibly be called several times by */
    /* PredictorSetupDecode() if this function succeeds but */
    /* PredictorSetup() fails */
    if ((sp->state & ZSTATE_INIT_DECODE) == 0 &&
        inflateInit(&sp->stream) != Z_OK)
    {
        TIFFErrorExtR(tif, module, "%s", SAFE_MSG(sp));
        return (0);
    }
    else
    {
        sp->state |= ZSTATE_INIT_DECODE;
        return (1);
    }
}